

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::InputScalarN(char *label,ImGuiDataType data_type,void *v,int components,void *step,
                        void *step_fast,char *format,ImGuiInputTextFlags extra_flags)

{
  ImGuiWindow *pIVar1;
  size_t sVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  bool bVar6;
  char *text_end;
  int int_id;
  float fVar7;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (pIVar1->SkipItems == false) {
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components,0.0);
    int_id = 0;
    if (components < 1) {
      bVar6 = false;
    }
    else {
      sVar2 = GDataTypeInfo[data_type].Size;
      bVar6 = false;
      do {
        PushID(int_id);
        bVar5 = InputScalar("##v",data_type,v,step,step_fast,format,extra_flags);
        pIVar4 = GImGui;
        fVar7 = (pIVar3->Style).ItemInnerSpacing.x;
        pIVar1 = GImGui->CurrentWindow;
        pIVar1->WriteAccessed = true;
        if (pIVar1->SkipItems == false) {
          if (fVar7 < 0.0) {
            fVar7 = (pIVar4->Style).ItemSpacing.x;
          }
          (pIVar1->DC).CursorPos.x = fVar7 + (pIVar1->DC).CursorPosPrevLine.x;
          (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
          (pIVar1->DC).CurrentLineHeight = (pIVar1->DC).PrevLineHeight;
          (pIVar1->DC).CurrentLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
        }
        bVar6 = (bool)(bVar6 | bVar5);
        PopID();
        PopItemWidth();
        v = (void *)((long)v + sVar2);
        int_id = int_id + 1;
      } while (components != int_id);
    }
    PopID();
    text_end = label;
    if (label != (char *)0xffffffffffffffff) {
      do {
        if (*text_end == '#') {
          if (text_end[1] == '#') goto LAB_00181e17;
        }
        else if (*text_end == '\0') goto LAB_00181e17;
        text_end = text_end + 1;
      } while (text_end != (char *)0xffffffffffffffff);
      text_end = (char *)0xffffffffffffffff;
    }
LAB_00181e17:
    TextUnformatted(label,text_end);
    EndGroup();
  }
  else {
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool ImGui::InputScalarN(const char* label, ImGuiDataType data_type, void* v, int components, const void* step, const void* step_fast, const char* format, ImGuiInputTextFlags extra_flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    size_t type_size = GDataTypeInfo[data_type].Size;
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= InputScalar("##v", data_type, v, step, step_fast, format, extra_flags);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
        v = (void*)((char*)v + type_size);
    }
    PopID();

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();

    return value_changed;
}